

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O1

Rect __thiscall nite::Rect::operator-(Rect *this,Rect *r)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *in_RDI;
  Rect RVar5;
  
  fVar1 = this->x;
  *in_RDI = fVar1;
  fVar2 = this->y;
  in_RDI[1] = fVar2;
  fVar3 = this->w;
  in_RDI[2] = fVar3;
  fVar4 = this->h;
  in_RDI[3] = fVar4;
  RVar5.x = fVar1 - r->x;
  RVar5.y = 0.0;
  *in_RDI = RVar5.x;
  RVar5.w = fVar2 - r->y;
  in_RDI[1] = RVar5.w;
  in_RDI[2] = fVar3 - r->w;
  in_RDI[3] = fVar4 - r->h;
  RVar5.h = 0.0;
  return RVar5;
}

Assistant:

nite::Rect nite::Rect::operator-(const nite::Rect &r){
	Rect R = *this;
	R.x -= r.x;
	R.y -= r.y;
	R.w -= r.w;
	R.h -= r.h;
	return R;
}